

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O1

string * hexdumpunit_abi_cxx11_
                   (string *__return_storage_ptr__,uint8_t *buf,size_t bytelen,DumpUnitType unittype
                   )

{
  long lVar1;
  size_t len;
  ulong uVar2;
  string local_58;
  uint8_t *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38 = buf;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (bytelen != 0) {
    lVar1 = (long)(1 << ((byte)unittype & 0x1f));
    uVar2 = 0;
    len = bytelen;
    do {
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      dumponeunit_abi_cxx11_(&local_58,local_38 + uVar2,len,unittype);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      uVar2 = uVar2 + lVar1;
      len = len - lVar1;
    } while (uVar2 < bytelen);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string hexdumpunit(const uint8_t *buf, size_t bytelen, DumpUnitType unittype)
{
    std::string str;

    str.reserve(bytelen*3);
    for (size_t i=0 ; i<bytelen ; i+=DumpUnitSize(unittype)) {
        if (!str.empty())
            str += " ";
        str += dumponeunit(buf+i, bytelen-i, unittype);
    }

    return str;
}